

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O0

void __thiscall
RTree::distribute_polygons
          (RTree *this,RTree_node *node,RTree_node *brother,
          vector<d_leaf,_std::allocator<d_leaf>_> *data)

{
  Polygon *pPVar1;
  d_leaf data_00;
  d_leaf data_01;
  d_leaf data_02;
  d_leaf data_03;
  int iVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  int cost_brother;
  int cost_node;
  int m;
  int a;
  int j;
  int i;
  vector<d_leaf,_std::allocator<d_leaf>_> *data_local;
  RTree_node *brother_local;
  RTree_node *node_local;
  RTree *this_local;
  
  for (cost_node = 0; cost_node < node->father->elements; cost_node = cost_node + 1) {
    pvVar4 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                       (&node->father->data_internal_node,(long)cost_node);
    if (pvVar4->child == node) {
      a = cost_node;
    }
    else {
      pvVar4 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         (&node->father->data_internal_node,(long)cost_node);
      if (pvVar4->child == brother) {
        m = cost_node;
      }
    }
  }
  for (cost_brother = 0; sVar5 = std::vector<d_leaf,_std::allocator<d_leaf>_>::size(data),
      (ulong)(long)cost_brother < sVar5; cost_brother = cost_brother + 1) {
    pvVar4 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                       (&node->father->data_internal_node,(long)a);
    pPVar1 = pvVar4->region;
    pvVar6 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[](data,(long)cost_brother);
    iVar2 = Polygon::cost_two_poligons(pPVar1,pvVar6->region);
    pvVar4 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                       (&brother->father->data_internal_node,(long)m);
    pPVar1 = pvVar4->region;
    pvVar6 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[](data,(long)cost_brother);
    iVar3 = Polygon::cost_two_poligons(pPVar1,pvVar6->region);
    if ((iVar2 < iVar3) && (node->elements < (this->M - this->m) + 1)) {
      pvVar6 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[](data,(long)cost_brother);
      data_00.polygon = pvVar6->polygon;
      data_00.region = pvVar6->region;
      insert_polygon(this,node,data_00);
    }
    else if ((iVar3 < iVar2) && (brother->elements < (this->M - this->m) + 1)) {
      pvVar6 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[](data,(long)cost_brother);
      data_01.polygon = pvVar6->polygon;
      data_01.region = pvVar6->region;
      insert_polygon(this,brother,data_01);
    }
    else if (node->elements < (this->M - this->m) + 1) {
      pvVar6 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[](data,(long)cost_brother);
      data_02.polygon = pvVar6->polygon;
      data_02.region = pvVar6->region;
      insert_polygon(this,node,data_02);
    }
    else {
      pvVar6 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[](data,(long)cost_brother);
      data_03.polygon = pvVar6->polygon;
      data_03.region = pvVar6->region;
      insert_polygon(this,brother,data_03);
    }
  }
  return;
}

Assistant:

void RTree::distribute_polygons(RTree_node * node, RTree_node * brother, const std::vector<d_leaf> & data){
    int i, j ;
    //Search where is the node & brother in the father.
    for(int a = 0; a < node->father->elements; a++){
        if(node->father->data_internal_node[a].child == node){
            i = a;
        }
        else if(node->father->data_internal_node[a].child == brother){
            j = a;
        }
    }
    for(int m = 0; m < data.size(); m++){
        int cost_node = node->father->data_internal_node[i].region->cost_two_poligons(*data[m].region);
        int cost_brother = brother->father->data_internal_node[j].region->cost_two_poligons(*data[m].region);
        if(cost_node < cost_brother && node->elements < this->M - this->m + 1){
            insert_polygon(node, data[m]);
        }
        else if(cost_node > cost_brother && brother->elements < this->M - this->m + 1){
            insert_polygon(brother, data[m]);
        }
        else{
            if(node->elements < this->M - this->m + 1){
                insert_polygon(node, data[m]);
            }
            else{
                insert_polygon(brother, data[m]);
            }
        }
    }
}